

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_and_array.cpp
# Opt level: O0

int vector_and_array(void)

{
  reference pvVar1;
  ostream *poVar2;
  void *pvVar3;
  reference pvVar4;
  undefined1 auStack_98 [8];
  array<double,_4UL> a4;
  array<double,_4UL> a3;
  allocator<double> local_41;
  undefined1 local_40 [8];
  vector<double,_std::allocator<double>_> a2;
  double a1 [4];
  
  a1[1] = 3.6;
  a1[2] = 4.8;
  a2.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x3ff3333333333333;
  a1[0] = 2.4;
  std::allocator<double>::allocator(&local_41);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_40,4,&local_41);
  std::allocator<double>::~allocator(&local_41);
  pvVar1 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)local_40,0);
  *pvVar1 = 1.1;
  pvVar1 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)local_40,1);
  *pvVar1 = 1.2;
  pvVar1 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)local_40,2);
  *pvVar1 = 1.3;
  pvVar1 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)local_40,3);
  *pvVar1 = 1.4;
  a4._M_elems[3] = 0.1;
  a4._M_elems[1] = 0.3;
  a4._M_elems[2] = 0.4;
  auStack_98 = (undefined1  [8])0x3fb999999999999a;
  a4._M_elems[0] = 0.2;
  poVar2 = std::operator<<((ostream *)&std::cout,"a1[2]: ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,a1[1]);
  poVar2 = std::operator<<(poVar2," at ");
  pvVar3 = (void *)std::ostream::operator<<(poVar2,a1 + 1);
  std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)&std::cout,"a2[2]: ");
  pvVar1 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)local_40,2);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,*pvVar1);
  poVar2 = std::operator<<(poVar2," at ");
  pvVar1 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)local_40,2);
  pvVar3 = (void *)std::ostream::operator<<(poVar2,pvVar1);
  std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)&std::cout,"a3[2]: ");
  pvVar4 = std::array<double,_4UL>::operator[]((array<double,_4UL> *)(a4._M_elems + 3),2);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,*pvVar4);
  poVar2 = std::operator<<(poVar2," at ");
  pvVar4 = std::array<double,_4UL>::operator[]((array<double,_4UL> *)(a4._M_elems + 3),2);
  pvVar3 = (void *)std::ostream::operator<<(poVar2,pvVar4);
  std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)&std::cout,"a4[2]: ");
  pvVar4 = std::array<double,_4UL>::operator[]((array<double,_4UL> *)auStack_98,2);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,*pvVar4);
  poVar2 = std::operator<<(poVar2," at ");
  pvVar4 = std::array<double,_4UL>::operator[]((array<double,_4UL> *)auStack_98,2);
  pvVar3 = (void *)std::ostream::operator<<(poVar2,pvVar4);
  std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
  a2.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x402699999999999a;
  poVar2 = std::operator<<((ostream *)&std::cout,"a1[-2]: ");
  poVar2 = (ostream *)
           std::ostream::operator<<
                     (poVar2,(double)a2.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                     super__Vector_impl_data._M_start);
  poVar2 = std::operator<<(poVar2," at ");
  pvVar3 = (void *)std::ostream::operator<<(poVar2,&a2);
  std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)&std::cout,"a2[2]: ");
  pvVar1 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)local_40,2);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,*pvVar1);
  poVar2 = std::operator<<(poVar2," at ");
  pvVar1 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)local_40,2);
  pvVar3 = (void *)std::ostream::operator<<(poVar2,pvVar1);
  std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)&std::cout,"a3[2]: ");
  pvVar4 = std::array<double,_4UL>::operator[]((array<double,_4UL> *)(a4._M_elems + 3),2);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,*pvVar4);
  poVar2 = std::operator<<(poVar2," at ");
  pvVar4 = std::array<double,_4UL>::operator[]((array<double,_4UL> *)(a4._M_elems + 3),2);
  pvVar3 = (void *)std::ostream::operator<<(poVar2,pvVar4);
  std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)&std::cout,"a4[2]: ");
  pvVar4 = std::array<double,_4UL>::operator[]((array<double,_4UL> *)auStack_98,2);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,*pvVar4);
  poVar2 = std::operator<<(poVar2," at ");
  pvVar4 = std::array<double,_4UL>::operator[]((array<double,_4UL> *)auStack_98,2);
  pvVar3 = (void *)std::ostream::operator<<(poVar2,pvVar4);
  std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)local_40);
  return 0;
}

Assistant:

int vector_and_array () {
    using namespace std;
    //  default array, in "stack"
    double a1[4] = {1.2, 2.4, 3.6, 4.8};

    //  vector, use "heap" to store data
    vector<double> a2(4);
    a2[0] = 1.1;
    a2[1] = 1.2;
    a2[2] = 1.3;
    a2[3] = 1.4;

    //  array in c++11, use "stack" to store data
    array<double, 4> a3 = {0.1, 0.2, 0.3, 0.4};
    array<double, 4> a4 = a3;

    cout << "a1[2]: " << a1[2] << " at " << &a1[2] << endl;
    cout << "a2[2]: " << a2[2] << " at " << &a2[2] << endl;
    cout << "a3[2]: " << a3[2] << " at " << &a3[2] << endl;
    cout << "a4[2]: " << a4[2] << " at " << &a4[2] << endl;

    //  danger operation
    a1[-2] = 11.3;

    cout << "a1[-2]: " << a1[-2] << " at " << &a1[-2] << endl;
    cout << "a2[2]: " << a2[2] << " at " << &a2[2] << endl;
    cout << "a3[2]: " << a3[2] << " at " << &a3[2] << endl;
    cout << "a4[2]: " << a4[2] << " at " << &a4[2] << endl;

    return 0;
}